

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O2

void __thiscall CGameContext::Clear(CGameContext *this)

{
  int iVar1;
  long lVar2;
  CVoteOptionServer *pCVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  long lVar9;
  CTuningParams *pCVar10;
  CTuningParams *pCVar11;
  long in_FS_OFFSET;
  byte bVar12;
  CTuningParams Tuning;
  
  bVar12 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = this->m_pVoteOptionLast;
  iVar1 = this->m_NumVoteOptions;
  lVar9 = 0x20;
  pCVar10 = &this->m_Tuning;
  pCVar11 = &Tuning;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pCVar11->m_GroundControlSpeed).m_Value = (pCVar10->m_GroundControlSpeed).m_Value;
    pCVar10 = (CTuningParams *)&pCVar10->m_GroundControlAccel;
    pCVar11 = (CTuningParams *)&pCVar11->m_GroundControlAccel;
  }
  this->m_Resetting = true;
  uVar4 = *(undefined4 *)&this->m_pVoteOptionHeap;
  uVar5 = *(undefined4 *)((long)&this->m_pVoteOptionHeap + 4);
  uVar6 = *(undefined4 *)&this->m_pVoteOptionFirst;
  uVar7 = *(undefined4 *)((long)&this->m_pVoteOptionFirst + 4);
  (**(this->super_IGameServer).super_IInterface._vptr_IInterface)(this);
  mem_zero(this,0x36c8);
  CGameContext(this,0);
  *(undefined4 *)&this->m_pVoteOptionHeap = uVar4;
  *(undefined4 *)((long)&this->m_pVoteOptionHeap + 4) = uVar5;
  *(undefined4 *)&this->m_pVoteOptionFirst = uVar6;
  *(undefined4 *)((long)&this->m_pVoteOptionFirst + 4) = uVar7;
  this->m_pVoteOptionLast = pCVar3;
  this->m_NumVoteOptions = iVar1;
  pCVar10 = &Tuning;
  pCVar11 = &this->m_Tuning;
  for (; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pCVar11->m_GroundControlSpeed).m_Value = (pCVar10->m_GroundControlSpeed).m_Value;
    pCVar10 = (CTuningParams *)((long)pCVar10 + (ulong)bVar12 * -8 + 4);
    pCVar11 = (CTuningParams *)((long)pCVar11 + (ulong)bVar12 * -8 + 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::Clear()
{
	CHeap *pVoteOptionHeap = m_pVoteOptionHeap;
	CVoteOptionServer *pVoteOptionFirst = m_pVoteOptionFirst;
	CVoteOptionServer *pVoteOptionLast = m_pVoteOptionLast;
	int NumVoteOptions = m_NumVoteOptions;
	CTuningParams Tuning = m_Tuning;

	m_Resetting = true;
	this->~CGameContext();
	mem_zero(this, sizeof(*this));
	new (this) CGameContext(RESET);

	m_pVoteOptionHeap = pVoteOptionHeap;
	m_pVoteOptionFirst = pVoteOptionFirst;
	m_pVoteOptionLast = pVoteOptionLast;
	m_NumVoteOptions = NumVoteOptions;
	m_Tuning = Tuning;
}